

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantPrimitiveSetTestInstance::
compare(InvariantPrimitiveSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  ostringstream *this_00;
  PerPrimitive *primitivesA_00;
  bool bVar1;
  MessageBuilder local_190;
  
  primitivesA_00 =
       (primitivesA->
       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
       )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = comparePrimitivesExact
                    (primitivesA_00,
                     (primitivesB->
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (int)((ulong)((long)(primitivesA->
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)primitivesA_00) >> 6));
  if (!bVar1) {
    local_190.m_log =
         ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    this_00 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,
                    "Failure: tessellation coordinates differ between two programs");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return bVar1;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (!comparePrimitivesExact(&primitivesA[0], &primitivesB[0], static_cast<int>(primitivesA.size())))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: tessellation coordinates differ between two programs" << tcu::TestLog::EndMessage;

			return false;
		}
		return true;
	}